

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall ymfm::ym2608::reset(ym2608 *this)

{
  adpcm_a_engine *paVar1;
  
  fm_engine_base<ymfm::opn_registers_base<true>_>::reset
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  ssg_engine::reset(&this->m_ssg);
  adpcm_a_engine::reset(&this->m_adpcm_a);
  adpcm_b_engine::reset(&this->m_adpcm_b);
  paVar1 = &this->m_adpcm_a;
  (paVar1->m_regs).m_regdata[0x10] = '\0';
  (paVar1->m_regs).m_regdata[0x11] = 0xc0;
  (paVar1->m_regs).m_regdata[0x12] = '@';
  (paVar1->m_regs).m_regdata[0x13] = 0x80;
  paVar1 = &this->m_adpcm_a;
  (paVar1->m_regs).m_regdata[0x18] = '\0';
  (paVar1->m_regs).m_regdata[0x19] = '\x01';
  (paVar1->m_regs).m_regdata[0x1a] = '\x04';
  (paVar1->m_regs).m_regdata[0x1b] = '\x1b';
  paVar1 = &this->m_adpcm_a;
  (paVar1->m_regs).m_regdata[0x20] = 0xbf;
  (paVar1->m_regs).m_regdata[0x21] = '?';
  (paVar1->m_regs).m_regdata[0x22] = '\x7f';
  (paVar1->m_regs).m_regdata[0x23] = 0xff;
  paVar1 = &this->m_adpcm_a;
  (paVar1->m_regs).m_regdata[0x28] = '\x01';
  (paVar1->m_regs).m_regdata[0x29] = '\x04';
  (paVar1->m_regs).m_regdata[0x2a] = '\x1b';
  (paVar1->m_regs).m_regdata[0x2b] = '\x1c';
  (this->m_adpcm_a).m_regs.m_regdata[0x14] = '\0';
  (this->m_adpcm_a).m_regs.m_regdata[0x15] = 0x80;
  (this->m_adpcm_a).m_regs.m_regdata[0x1c] = '\x1d';
  (this->m_adpcm_a).m_regs.m_regdata[0x1d] = '\x1f';
  (this->m_adpcm_a).m_regs.m_regdata[0x24] = '\x7f';
  (this->m_adpcm_a).m_regs.m_regdata[0x25] = 0xff;
  (this->m_adpcm_a).m_regs.m_regdata[0x2c] = '\x1f';
  (this->m_adpcm_a).m_regs.m_regdata[0x2d] = '\x1f';
  this->m_irq_enable = '\x1f';
  this->m_flag_control = '\x1c';
  read_status_hi(this);
  return;
}

Assistant:

void ym2608::reset()
{
	// reset the engines
	m_fm.reset();
	m_ssg.reset();
	m_adpcm_a.reset();
	m_adpcm_b.reset();

	// configure ADPCM percussion sounds; these are present in an embedded ROM
	m_adpcm_a.set_start_end(0, 0x0000, 0x01bf); // bass drum
	m_adpcm_a.set_start_end(1, 0x01c0, 0x043f); // snare drum
	m_adpcm_a.set_start_end(2, 0x0440, 0x1b7f); // top cymbal
	m_adpcm_a.set_start_end(3, 0x1b80, 0x1cff); // high hat
	m_adpcm_a.set_start_end(4, 0x1d00, 0x1f7f); // tom tom
	m_adpcm_a.set_start_end(5, 0x1f80, 0x1fff); // rim shot

	// initialize our special interrupt states, then read the upper status
	// register, which updates the IRQs
	m_irq_enable = 0x1f;
	m_flag_control = 0x1c;
	read_status_hi();
}